

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

ImGuiID ImGui::DockBuilderSplitNode
                  (ImGuiID id,ImGuiDir split_dir,float size_ratio_for_node_at_dir,
                  ImGuiID *out_id_at_dir,ImGuiID *out_id_at_opposite_dir)

{
  ImGuiID IVar1;
  ImGuiID IVar2;
  ImGuiContext *ctx;
  ImGuiDockNode *pIVar3;
  bool bVar4;
  ImGuiDockRequest local_70;
  
  ctx = GImGui;
  if (split_dir == -1) {
    __assert_fail("split_dir != ImGuiDir_None",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O2/_deps/imgui-src/imgui.cpp"
                  ,0x40ff,
                  "ImGuiID ImGui::DockBuilderSplitNode(ImGuiID, ImGuiDir, float, ImGuiID *, ImGuiID *)"
                 );
  }
  pIVar3 = (ImGuiDockNode *)ImGuiStorage::GetVoidPtr(&(GImGui->DockContext).Nodes,id);
  if (pIVar3 != (ImGuiDockNode *)0x0) {
    if (pIVar3->ChildNodes[0] == (ImGuiDockNode *)0x0) {
      local_70.UndockTargetWindow = (ImGuiWindow *)0x0;
      local_70.UndockTargetNode = (ImGuiDockNode *)0x0;
      local_70.Type = ImGuiDockRequestType_Split;
      local_70.DockTargetWindow = (ImGuiWindow *)0x0;
      local_70.DockPayload = (ImGuiWindow *)0x0;
      bVar4 = (split_dir & 0xfffffffdU) == 0;
      if (!bVar4) {
        size_ratio_for_node_at_dir = 1.0 - size_ratio_for_node_at_dir;
      }
      local_70.DockSplitRatio = 1.0;
      if (size_ratio_for_node_at_dir <= 1.0) {
        local_70.DockSplitRatio = size_ratio_for_node_at_dir;
      }
      local_70.DockSplitRatio =
           (float)(~-(uint)(size_ratio_for_node_at_dir < 0.0) & (uint)local_70.DockSplitRatio);
      local_70.DockSplitOuter = false;
      local_70.DockTargetNode = pIVar3;
      local_70.DockSplitDir = split_dir;
      DockContextProcessDock(ctx,&local_70);
      IVar1 = pIVar3->ChildNodes[!bVar4]->ID;
      IVar2 = pIVar3->ChildNodes[bVar4]->ID;
      if (out_id_at_dir != (ImGuiID *)0x0) {
        *out_id_at_dir = IVar1;
      }
      if (out_id_at_opposite_dir != (ImGuiID *)0x0) {
        *out_id_at_opposite_dir = IVar2;
      }
      return IVar1;
    }
    __assert_fail("!node->IsSplitNode()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O2/_deps/imgui-src/imgui.cpp"
                  ,0x4109,
                  "ImGuiID ImGui::DockBuilderSplitNode(ImGuiID, ImGuiDir, float, ImGuiID *, ImGuiID *)"
                 );
  }
  __assert_fail("node != __null",
                "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O2/_deps/imgui-src/imgui.cpp"
                ,0x4105,
                "ImGuiID ImGui::DockBuilderSplitNode(ImGuiID, ImGuiDir, float, ImGuiID *, ImGuiID *)"
               );
}

Assistant:

ImGuiID ImGui::DockBuilderSplitNode(ImGuiID id, ImGuiDir split_dir, float size_ratio_for_node_at_dir, ImGuiID* out_id_at_dir, ImGuiID* out_id_at_opposite_dir)
{
    ImGuiContext* ctx = GImGui;
    IM_ASSERT(split_dir != ImGuiDir_None);
    IMGUI_DEBUG_LOG_DOCKING("DockBuilderSplitNode node 0x%08X, split_dir %d\n", id, split_dir);

    ImGuiDockNode* node = DockContextFindNodeByID(ctx, id);
    if (node == NULL)
    {
        IM_ASSERT(node != NULL);
        return 0;
    }

    IM_ASSERT(!node->IsSplitNode()); // Assert if already Split

    ImGuiDockRequest req;
    req.Type = ImGuiDockRequestType_Split;
    req.DockTargetWindow = NULL;
    req.DockTargetNode = node;
    req.DockPayload = NULL;
    req.DockSplitDir = split_dir;
    req.DockSplitRatio = ImSaturate((split_dir == ImGuiDir_Left || split_dir == ImGuiDir_Up) ? size_ratio_for_node_at_dir : 1.0f - size_ratio_for_node_at_dir);
    req.DockSplitOuter = false;
    DockContextProcessDock(ctx, &req);

    ImGuiID id_at_dir = node->ChildNodes[(split_dir == ImGuiDir_Left || split_dir == ImGuiDir_Up) ? 0 : 1]->ID;
    ImGuiID id_at_opposite_dir = node->ChildNodes[(split_dir == ImGuiDir_Left || split_dir == ImGuiDir_Up) ? 1 : 0]->ID;
    if (out_id_at_dir)
        *out_id_at_dir = id_at_dir;
    if (out_id_at_opposite_dir)
        *out_id_at_opposite_dir = id_at_opposite_dir;
    return id_at_dir;
}